

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O0

void __thiscall
cmCTestMultiProcessHandler::LockResources(cmCTestMultiProcessHandler *this,int index)

{
  mapped_type pcVar1;
  size_t sVar2;
  mapped_type *ppcVar3;
  iterator __first;
  iterator __last;
  pointer puVar4;
  pointer puVar5;
  reference __x;
  _Rb_tree_const_iterator<unsigned_long> local_70;
  iterator p;
  size_t i;
  undefined1 local_50 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> affinity;
  size_t needProcessors;
  cmCTestTestProperties *properties;
  cmCTestMultiProcessHandler *pcStack_10;
  int index_local;
  cmCTestMultiProcessHandler *this_local;
  
  properties._4_4_ = index;
  pcStack_10 = this;
  sVar2 = GetProcessorsUsed(this,index);
  this->RunningCount = sVar2 + this->RunningCount;
  ppcVar3 = std::
            map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
            ::operator[](&(this->Properties).
                          super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                         ,(key_type_conflict1 *)((long)&properties + 4));
  pcVar1 = *ppcVar3;
  __first = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::begin(&pcVar1->ProjectResources);
  __last = std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(&pcVar1->ProjectResources);
  std::
  set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>::
  insert<std::_Rb_tree_const_iterator<std::__cxx11::string>>
            ((set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&this->ProjectResourcesLocked,
             (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )__first._M_node,
             (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )__last._M_node);
  if ((pcVar1->RunSerial & 1U) != 0) {
    this->SerialTestRunning = true;
  }
  if ((this->HaveAffinity != 0) && ((pcVar1->WantAffinity & 1U) != 0)) {
    puVar4 = (pointer)GetProcessorsUsed(this,properties._4_4_);
    affinity.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = puVar4;
    puVar5 = (pointer)std::
                      set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
                      size(&this->ProcessorsAvailable);
    if (puVar5 < puVar4) {
      __assert_fail("needProcessors <= this->ProcessorsAvailable.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                    ,0x1cd,"void cmCTestMultiProcessHandler::LockResources(int)");
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_50);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_50,
               (size_type)
               affinity.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage);
    for (p._M_node = (_Base_ptr)0x0;
        p._M_node <
        affinity.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage;
        p._M_node = (_Base_ptr)((long)&(p._M_node)->_M_color + 1)) {
      local_70._M_node =
           (_Base_ptr)
           std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::begin
                     (&this->ProcessorsAvailable);
      __x = std::_Rb_tree_const_iterator<unsigned_long>::operator*(&local_70);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_50,__x);
      std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>::
      erase_abi_cxx11_((set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>> *)
                       &this->ProcessorsAvailable,(const_iterator)local_70._M_node);
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
              (&pcVar1->Affinity,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_50);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_50);
  }
  return;
}

Assistant:

void cmCTestMultiProcessHandler::LockResources(int index)
{
  this->RunningCount += this->GetProcessorsUsed(index);

  auto* properties = this->Properties[index];

  this->ProjectResourcesLocked.insert(properties->ProjectResources.begin(),
                                      properties->ProjectResources.end());

  if (properties->RunSerial) {
    this->SerialTestRunning = true;
  }

  if (this->HaveAffinity && properties->WantAffinity) {
    size_t needProcessors = this->GetProcessorsUsed(index);
    assert(needProcessors <= this->ProcessorsAvailable.size());
    std::vector<size_t> affinity;
    affinity.reserve(needProcessors);
    for (size_t i = 0; i < needProcessors; ++i) {
      auto p = this->ProcessorsAvailable.begin();
      affinity.push_back(*p);
      this->ProcessorsAvailable.erase(p);
    }
    properties->Affinity = std::move(affinity);
  }
}